

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

bool __thiscall
ON_Matrix::BackSolve(ON_Matrix *this,double zero_tolerance,int Bsize,ON_3dPoint *B,ON_3dPoint *X)

{
  double **ppdVar1;
  bool bVar2;
  double ***pppdVar3;
  ulong uVar4;
  ON_3dPoint *pOVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  ON_3dPoint *local_90;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  iVar6 = this->m_col_count;
  if ((this->m_row_count < iVar6) || (this->m_row_count < Bsize || Bsize < iVar6)) {
LAB_004f99bf:
    bVar2 = false;
  }
  else {
    if (iVar6 < Bsize) {
      pOVar5 = B + iVar6;
      iVar6 = Bsize - iVar6;
      do {
        dVar9 = ON_3dPoint::MaximumCoordinate(pOVar5);
        if (zero_tolerance < dVar9) goto LAB_004f99bf;
        pOVar5 = pOVar5 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    pppdVar3 = &this->m;
    if (this->m_row_count == (this->m_rowmem).m_count) {
      pppdVar3 = &(this->m_rowmem).m_a;
    }
    ppdVar1 = *pppdVar3;
    iVar6 = this->m_col_count;
    if (X == B) {
      if (iVar6 < 2) {
        return true;
      }
      uVar4 = (ulong)(iVar6 - 1);
      local_90 = X + uVar4;
      uVar7 = (ulong)(iVar6 - 2);
      do {
        if ((long)(uVar7 + 1) < (long)this->m_col_count) {
          pOVar5 = local_90;
          uVar8 = uVar4;
          do {
            ::operator*(&local_60,ppdVar1[uVar7][uVar8],pOVar5);
            ON_3dVector::ON_3dVector(&local_48,&local_60);
            ON_3dPoint::operator-=(X + uVar7,&local_48);
            uVar8 = uVar8 + 1;
            pOVar5 = pOVar5 + 1;
          } while ((int)uVar8 < this->m_col_count);
        }
        uVar4 = uVar4 - 1;
        local_90 = local_90 + -1;
        bVar2 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar2);
    }
    else {
      X[(long)iVar6 + -1].z = B[(long)iVar6 + -1].z;
      dVar9 = B[(long)iVar6 + -1].y;
      X[(long)iVar6 + -1].x = B[(long)iVar6 + -1].x;
      X[(long)iVar6 + -1].y = dVar9;
      iVar6 = this->m_col_count;
      if (iVar6 < 2) {
        return true;
      }
      uVar4 = (ulong)(iVar6 - 1);
      local_90 = X + uVar4;
      uVar7 = (ulong)(iVar6 - 2);
      do {
        X[uVar7].z = B[uVar7].z;
        dVar9 = B[uVar7].y;
        X[uVar7].x = B[uVar7].x;
        X[uVar7].y = dVar9;
        if ((long)(uVar7 + 1) < (long)this->m_col_count) {
          pOVar5 = local_90;
          uVar8 = uVar4;
          do {
            ::operator*(&local_60,ppdVar1[uVar7][uVar8],pOVar5);
            ON_3dVector::ON_3dVector(&local_48,&local_60);
            ON_3dPoint::operator-=(X + uVar7,&local_48);
            uVar8 = uVar8 + 1;
            pOVar5 = pOVar5 + 1;
          } while ((int)uVar8 < this->m_col_count);
        }
        uVar4 = uVar4 - 1;
        local_90 = local_90 + -1;
        bVar2 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar2);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int Bsize,
    const ON_3dPoint* B,
    ON_3dPoint* X
    ) const
{
  int i, j;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) {
    if ( B[i].MaximumCoordinate() > zero_tolerance )
      return false; // over determined
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( X != B )
  {
    X[m_col_count-1] = B[m_col_count-1];
    for ( i = m_col_count-2; i >= 0; i-- ) {
      X[i] = B[i];
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }

  return true;
}